

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualSlackViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  cpp_dec_float<100U,_int,_void> *pcVar7;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar8;
  Item *pIVar9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slacks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  uint local_e8 [3];
  undefined3 uStack_db;
  int iStack_d8;
  bool bStack_d4;
  undefined8 local_d0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_b0;
  cpp_dec_float<100U,_int,_void> *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint local_58 [3];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  local_98 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_b0,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_c8,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this,&local_b0);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x61])(this,&local_c8);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar6 = 0;
    local_120 = this;
    do {
      pIVar9 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar6].idx;
      local_40._0_4_ = cpp_dec_float_finite;
      local_40._4_4_ = 0x10;
      local_88 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_58[0] = 0;
      local_58[1] = 0;
      stack0xffffffffffffffb0 = 0;
      uStack_4b = 0;
      iStack_48 = 0;
      bStack_44 = false;
      local_90 = lVar6;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_88,0.0);
      if (0 < (pIVar9->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar8 = 0;
        lVar6 = 0;
        do {
          pNVar2 = (pIVar9->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar7 = &local_b0.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pNVar2->val + 1) + lVar8)].m_backend;
          pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                   ((long)(pNVar2->val).m_backend.data._M_elems + lVar8);
          local_130._0_4_ = cpp_dec_float_finite;
          local_130._4_4_ = 0x10;
          local_178 = (undefined1  [16])0x0;
          local_168 = (undefined1  [16])0x0;
          local_158 = (undefined1  [16])0x0;
          local_148[0] = 0;
          local_148[1] = 0;
          stack0xfffffffffffffec0 = 0;
          uStack_13b = 0;
          iStack_138 = 0;
          bStack_134 = false;
          v = pcVar1;
          if (((cpp_dec_float<100U,_int,_void> *)local_178 != pcVar7) &&
             (v = pcVar7, pcVar1 != (cpp_dec_float<100U,_int,_void> *)local_178)) {
            local_178 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_168 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 4);
            local_158 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 8);
            local_148._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            stack0xfffffffffffffec0 = (undefined5)uVar3;
            uStack_13b = (undefined3)((ulong)uVar3 >> 0x28);
            iStack_138 = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar8);
            bStack_134 = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar8 + 4);
            local_130 = *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar8 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_178,v);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_88,
                     (cpp_dec_float<100U,_int,_void> *)local_178);
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + 0x54;
        } while (lVar6 < (pIVar9->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
      lVar6 = local_90;
      local_d0._0_4_ = cpp_dec_float_finite;
      local_d0._4_4_ = 0x10;
      local_118 = (undefined1  [16])0x0;
      local_108 = (undefined1  [16])0x0;
      local_f8 = (undefined1  [16])0x0;
      local_e8[0] = 0;
      local_e8[1] = 0;
      stack0xffffffffffffff20 = 0;
      uStack_db = 0;
      iStack_d8 = 0;
      bStack_d4 = false;
      if ((cpp_dec_float<100U,_int,_void> *)local_118 ==
          &local_c8.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_90].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_118,
                   (cpp_dec_float<100U,_int,_void> *)local_88);
        if (local_118._0_4_ != 0 || (fpclass_type)local_d0 != cpp_dec_float_finite) {
          bStack_d4 = (bool)(bStack_d4 ^ 1);
        }
      }
      else {
        local_e8[0] = local_58[0];
        local_e8[1] = local_58[1];
        stack0xffffffffffffff20 = stack0xffffffffffffffb0;
        uStack_db = uStack_4b;
        local_f8 = local_68;
        local_108 = local_78;
        local_118 = local_88;
        iStack_d8 = iStack_48;
        bStack_d4 = bStack_44;
        local_d0._0_4_ = (fpclass_type)local_40;
        local_d0._4_4_ = local_40._4_4_;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_118,
                   &local_c8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_90].m_backend);
      }
      this = local_120;
      local_148[0] = local_e8[0];
      local_148[1] = local_e8[1];
      stack0xfffffffffffffec0 = stack0xffffffffffffff20;
      uStack_13b = uStack_db;
      local_158 = local_f8;
      local_168 = local_108;
      local_178 = local_118;
      auVar4 = local_178;
      iStack_138 = iStack_d8;
      bStack_134 = bStack_d4;
      local_130._0_4_ = (fpclass_type)local_d0;
      local_130._4_4_ = local_d0._4_4_;
      if ((bStack_d4 == true) &&
         (local_178._0_4_ = local_118._0_4_,
         local_178._0_4_ != 0 || (fpclass_type)local_d0 != cpp_dec_float_finite)) {
        bStack_134 = false;
      }
      local_178 = auVar4;
      if ((((fpclass_type)local_d0 != cpp_dec_float_NaN) &&
          ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_178,&maxviol->m_backend),
         0 < iVar5)) {
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_148._0_8_;
        *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
             CONCAT35(uStack_13b,stack0xfffffffffffffec0);
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_158._0_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_158._8_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_168._0_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_168._8_8_;
        *(undefined8 *)(maxviol->m_backend).data._M_elems = local_178._0_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_178._8_8_;
        (maxviol->m_backend).exp = iStack_138;
        (maxviol->m_backend).neg = bStack_134;
        (maxviol->m_backend).fpclass = (fpclass_type)local_130;
        (maxviol->m_backend).prec_elem = local_130._4_4_;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_98,(cpp_dec_float<100U,_int,_void> *)local_178);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  if (local_c8.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}